

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O0

int CVmObjBigNum::precision_from_string(char *str,size_t len,int radix)

{
  int iVar1;
  wchar_t wVar2;
  int iVar3;
  int in_EDX;
  long in_RSI;
  double dVar4;
  double dVar5;
  int d;
  wchar_t ch;
  int significant;
  int prec;
  size_t rem;
  utf8_ptr p;
  int inferred_radix;
  char *in_stack_ffffffffffffffa8;
  utf8_ptr *in_stack_ffffffffffffffb0;
  undefined6 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  size_t in_stack_ffffffffffffffd8;
  int iVar8;
  int local_4;
  
  iVar8 = 0;
  if (in_EDX == 0) {
    iVar8 = radix_from_string((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    in_EDX = iVar8;
  }
  if (in_EDX == 10) {
    local_4 = precision_from_string((char *)CONCAT44(10,iVar8),in_stack_ffffffffffffffd8);
  }
  else {
    utf8_ptr::utf8_ptr(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    while( true ) {
      uVar7 = false;
      if (in_RSI != 0) {
        utf8_ptr::getch((utf8_ptr *)0x2be918);
        iVar1 = is_space(L'\0');
        uVar7 = iVar1 != 0;
      }
      if ((bool)uVar7 == false) break;
      utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    (size_t *)
                    CONCAT17(uVar7,CONCAT16(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8)));
    }
    if ((in_RSI != 0) &&
       ((wVar2 = utf8_ptr::getch((utf8_ptr *)0x2be958), wVar2 == L'-' ||
        (wVar2 = utf8_ptr::getch((utf8_ptr *)0x2be967), wVar2 == L'+')))) {
      utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    (size_t *)
                    CONCAT17(uVar7,CONCAT16(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8)));
    }
    while( true ) {
      uVar6 = false;
      if (in_RSI != 0) {
        utf8_ptr::getch((utf8_ptr *)0x2be995);
        iVar1 = is_space(L'\0');
        uVar6 = iVar1 != 0;
      }
      if ((bool)uVar6 == false) break;
      utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    (size_t *)CONCAT17(uVar7,CONCAT16(uVar6,in_stack_ffffffffffffffb8)));
    }
    if ((((iVar8 == 0x10) && (in_RSI != 0)) &&
        (wVar2 = utf8_ptr::getch((utf8_ptr *)0x2be9dc), wVar2 == L'0')) &&
       ((wVar2 = utf8_ptr::getch_at(in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8),
        wVar2 == L'x' ||
        (wVar2 = utf8_ptr::getch_at(in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8),
        wVar2 == L'X')))) {
      utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    (size_t *)CONCAT17(uVar7,CONCAT16(uVar6,in_stack_ffffffffffffffb8)));
      utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    (size_t *)CONCAT17(uVar7,CONCAT16(uVar6,in_stack_ffffffffffffffb8)));
    }
    iVar1 = 0;
    iVar8 = 0;
    while (in_RSI != 0) {
      wVar2 = utf8_ptr::getch((utf8_ptr *)0x2bea4d);
      if ((wVar2 < L'0') || (L'9' < wVar2)) {
        if ((wVar2 < L'A') || (L'Z' < wVar2)) {
          if ((wVar2 < L'a') || (L'z' < wVar2)) break;
          iVar3 = wVar2 + L'\xffffffa9';
        }
        else {
          iVar3 = wVar2 + L'\xffffffc9';
        }
      }
      else {
        iVar3 = wVar2 + L'\xffffffd0';
      }
      if (in_EDX <= iVar3) break;
      if (wVar2 != L'0') {
        iVar1 = 1;
      }
      if (iVar1 != 0) {
        iVar8 = iVar8 + 1;
      }
      utf8_ptr::inc((utf8_ptr *)CONCAT44(wVar2,iVar3),
                    (size_t *)CONCAT17(uVar7,CONCAT16(uVar6,in_stack_ffffffffffffffb8)));
    }
    dVar4 = (double)iVar8;
    dVar5 = log10((double)in_EDX);
    dVar4 = ceil(dVar4 * dVar5);
    local_4 = (int)dVar4;
  }
  return local_4;
}

Assistant:

int CVmObjBigNum::precision_from_string(const char *str, size_t len, int radix)
{
    /* if the radix is zero, infer the radix from the string */
    int inferred_radix = 0;
    if (radix == 0)
        radix = inferred_radix = radix_from_string(str, len);

    /* for decimal values, parse the full floating point format */
    if (radix == 10)
        return precision_from_string(str, len);

    /* set up to scan the string */
    utf8_ptr p((char *)str);
    size_t rem = len;

    /* skip leading spaces */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* skip the sign if present */
    if (rem != 0 && (p.getch() == '-' || p.getch() == '+'))
        p.inc(&rem);

    /* skip more spaces after the sign */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* if we inferred the radix as hax, skip any '0x' marker */
    if (inferred_radix == 16
        && rem != 0
        && p.getch() == '0'
        && (p.getch_at(1) == 'x' || p.getch_at(1) == 'X'))
    {
        /* skip the '0x' prefix */
        p.inc(&rem);
        p.inc(&rem);
    }

    /* scan digits */
    int prec, significant = FALSE;
    for (prec = 0 ; rem != 0 ; p.inc(&rem))
    {
        /* get this character */
        wchar_t ch = p.getch();

        /* get the digit value of this character */
        int d;
        if (ch >= '0' && ch <= '9')
            d = ch - '0';
        else if (ch >= 'A' && ch <= 'Z')
            d = ch - 'A' + 10;
        else if (ch >= 'a' && ch <= 'z')
            d = ch - 'a' + 10;
        else
            break;

        /* if the digit isn't within the radix, it's not a digit after all */
        if (d >= radix)
            break;

        /* it's significant if it's not a leading zero */
        if (ch != '0')
            significant = TRUE;

        /* 
         *   if we have found a significant digit so far, count this one - do
         *   not count leading zeros, whether they occur before or after the
         *   decimal point 
         */
        if (significant)
            ++prec;
    }

    /*
     *   Figure the decimal precision required to hold a number in the given
     *   radix.  This is a simple linear conversion: N base-R digits require
     *   log(R)/log(10) decimal digits.  Using log10 as our canonical log
     *   base means that log(R)/log(10) == log(R)/1 == log(R).  We of course
     *   have to round up for any fractional digits.
     */
    return (int)ceil(prec * log10((double)radix));
}